

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intelligibility_enhancer.cc
# Opt level: O1

void __thiscall
webrtc::IntelligibilityEnhancer::SolveForGainsGivenLambda
          (IntelligibilityEnhancer *this,float lambda,size_t start_freq,float *sols)

{
  pointer pfVar1;
  pointer pfVar2;
  size_t sVar3;
  string *result;
  float fVar4;
  float fVar5;
  float fVar6;
  float alpha0;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  undefined1 local_1b8 [16];
  FatalMessage local_1a8;
  
  pfVar1 = (this->filtered_clear_pow_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (this->filtered_noise_pow_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (start_freq != 0) {
    sVar3 = 0;
    do {
      sols[sVar3] = 1.0;
      sVar3 = sVar3 + 1;
    } while (start_freq != sVar3);
  }
  if (start_freq < this->bank_size_) {
    local_1c0 = lambda;
    do {
      fVar4 = pfVar1[start_freq];
      if ((fVar4 < 1e-05) || (fVar6 = pfVar2[start_freq], fVar6 < 1e-05)) {
        sols[start_freq] = 1.0;
      }
      else {
        local_1c4 = pfVar1[start_freq];
        local_1c4 = local_1c4 * lambda * 0.9996 * local_1c4 * local_1c4;
        local_1a8.stream_ = (ostringstream)0x0;
        local_1a8._1_3_ = 0;
        if (0.0 <= local_1c4) {
          local_1b8._0_4_ = fVar4;
          local_1bc = fVar6;
          result = rtc::MakeCheckOpString<float,float>
                             (&local_1c4,(float *)&local_1a8,"alpha0 < 0.f");
          lambda = local_1c0;
          fVar4 = (float)local_1b8._0_4_;
          fVar6 = local_1bc;
        }
        else {
          result = (string *)0x0;
        }
        if (result != (string *)0x0) {
          rtc::FatalMessage::FatalMessage
                    (&local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/intelligibility/intelligibility_enhancer.cc"
                     ,0x145,result);
          rtc::FatalMessage::~FatalMessage(&local_1a8);
        }
        fVar5 = fVar4 * lambda * 1.9996 * fVar4 * fVar6;
        fVar4 = fVar5 * fVar5 +
                local_1c4 * -4.0 * (fVar4 * 0.0002 * fVar6 + fVar4 * lambda * fVar6 * fVar6);
        if (fVar4 <= 0.0) {
          fVar4 = 0.0;
        }
        if (fVar4 < 0.0) {
          local_1b8 = ZEXT416((uint)fVar5);
          fVar4 = sqrtf(fVar4);
          lambda = local_1c0;
          fVar5 = (float)local_1b8._0_4_;
        }
        else {
          fVar4 = SQRT(fVar4);
        }
        fVar4 = (-fVar5 - fVar4) / (local_1c4 + local_1c4);
        if (fVar4 <= 0.0) {
          fVar4 = 0.0;
        }
        sols[start_freq] = fVar4;
      }
      start_freq = start_freq + 1;
    } while (start_freq < this->bank_size_);
  }
  return;
}

Assistant:

void IntelligibilityEnhancer::SolveForGainsGivenLambda(float lambda,
                                                       size_t start_freq,
                                                       float* sols) {
  const float kMinPower = 1e-5f;

  const float* pow_x0 = filtered_clear_pow_.data();
  const float* pow_n0 = filtered_noise_pow_.data();

  for (size_t n = 0; n < start_freq; ++n) {
    sols[n] = 1.f;
  }

  // Analytic solution for optimal gains. See paper for derivation.
  for (size_t n = start_freq; n < bank_size_; ++n) {
    if (pow_x0[n] < kMinPower || pow_n0[n] < kMinPower) {
      sols[n] = 1.f;
    } else {
      const float gamma0 = 0.5f * kRho * pow_x0[n] * pow_n0[n] +
                           lambda * pow_x0[n] * pow_n0[n] * pow_n0[n];
      const float beta0 =
          lambda * pow_x0[n] * (2.f - kRho) * pow_x0[n] * pow_n0[n];
      const float alpha0 =
          lambda * pow_x0[n] * (1.f - kRho) * pow_x0[n] * pow_x0[n];
      RTC_DCHECK_LT(alpha0, 0.f);
      // The quadratic equation should always have real roots, but to guard
      // against numerical errors we limit it to a minimum of zero.
      sols[n] = std::max(
          0.f, (-beta0 - std::sqrt(std::max(
                             0.f, beta0 * beta0 - 4.f * alpha0 * gamma0))) /
                   (2.f * alpha0));
    }
  }
}